

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void jit_rec_ADD_LL(Trace *trace,BcIns bc)

{
  IrRef IVar1;
  IrRef IVar2;
  uint uVar3;
  
  uVar3 = bc >> 0x10 & 0xff;
  IVar1 = trace->last_modified[uVar3];
  if (IVar1 == 0) {
    IVar1 = ir_emit(trace,(ulong)(uVar3 << 0x10));
    trace->last_modified[uVar3] = IVar1;
  }
  uVar3 = bc >> 0x18;
  IVar2 = trace->last_modified[uVar3];
  if (IVar2 == 0) {
    IVar2 = ir_emit(trace,(ulong)(uVar3 << 0x10));
    trace->last_modified[uVar3] = IVar2;
  }
  IVar1 = ir_emit(trace,(ulong)CONCAT22(IVar2,IVar1) * 0x10000 + 0x100);
  trace->last_modified[(byte)(bc >> 8)] = IVar1;
  return;
}

Assistant:

void jit_rec_ADD_LL(Trace *trace, BcIns bc) {
	// Load the arguments to the add instruction
	IrRef left = ir_load_stack(trace, bc_arg2(bc));
	IrRef right = ir_load_stack(trace, bc_arg3(bc));

	// Emit an add instruction
	IrRef result = ir_emit(trace, ir_new2(IR_ADD, left, right));

	// Keep track of the last instruction that modified the destination slot
	trace->last_modified[bc_arg1(bc)] = result;

	// All the remaining arithmetic instructions are exactly like this...
}